

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall slang::driver::Driver::addParseOptions(Driver *this,Bag *bag)

{
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *puVar1;
  group_type_pointer pgVar2;
  slot_type *psVar3;
  undefined4 uVar4;
  int *piVar5;
  ulong uVar6;
  long *plVar7;
  ParserOptions len;
  size_t sVar8;
  char *pcVar9;
  value_type_pointer ppVar10;
  uint uVar11;
  size_t *psVar12;
  table_type *ptVar13;
  Driver *pDVar14;
  Bag *this_00;
  int iVar15;
  mapped_type *pmVar16;
  uint64_t uVar17;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *ppVar18;
  uint uVar19;
  ulong uVar20;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *ppVar21;
  value_type *elements_3;
  pointer pbVar22;
  basic_string_view<char,_std::char_traits<char>_> *pbVar23;
  basic_string_view<char,_std::char_traits<char>_> *pbVar24;
  pointer pbVar25;
  value_type_pointer ppVar26;
  group_type_pointer pgVar27;
  group_type_pointer pgVar28;
  basic_string_view<char,_std::char_traits<char>_> *pbVar29;
  group_type_pointer pgVar30;
  ulong uVar31;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
  *ptVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *ppVar36;
  value_type *elements_1;
  bool bVar37;
  char cVar38;
  uchar uVar39;
  char cVar43;
  uchar uVar44;
  char cVar45;
  uchar uVar46;
  char cVar47;
  uchar uVar48;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  uchar uVar69;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uchar uVar70;
  ParserOptions poptions;
  value_type *elements;
  LexerOptions loptions;
  SourceOptions soptions;
  value_type *elements_2;
  PreprocessorOptions ppoptions;
  try_emplace_args_t local_211;
  undefined1 local_210 [16];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *local_200;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  undefined8 local_1e8;
  uchar uStack_1e0;
  uchar uStack_1df;
  uchar uStack_1de;
  uchar uStack_1dd;
  uchar uStack_1dc;
  uchar uStack_1db;
  uchar uStack_1da;
  uchar uStack_1d9;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  Driver *local_1c0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *local_1b8;
  undefined1 local_1b0 [24];
  value_type_pointer ppStack_198;
  ulong local_190;
  ulong local_188;
  uint local_180;
  LanguageVersion LStack_17c;
  bool local_178;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
  *local_170;
  pointer local_168;
  value_type_pointer local_160;
  pointer local_158;
  basic_string_view<char,_std::char_traits<char>_> *local_150;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *local_148;
  pointer local_140;
  basic_string_view<char,_std::char_traits<char>_> *local_138;
  group_type_pointer local_130;
  group_type_pointer local_128;
  group_type_pointer local_120;
  SourceOptions local_118;
  undefined8 local_108;
  uchar uStack_100;
  uchar uStack_ff;
  uchar uStack_fe;
  uchar uStack_fd;
  uchar uStack_fc;
  uchar uStack_fb;
  uchar uStack_fa;
  uchar uStack_f9;
  undefined8 local_f8;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  uchar uStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  uchar uStack_e9;
  Bag *local_e8;
  basic_string_view<char,_std::char_traits<char>_> *local_e0;
  pointer local_d8;
  undefined1 local_d0 [40];
  undefined1 local_a8 [24];
  undefined1 auStack_90 [24];
  undefined1 local_78 [16];
  pointer local_68;
  size_t local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  undefined1 local_50 [16];
  ulong local_40;
  ulong local_38;
  
  local_118.numThreads.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       *(_Optional_base<unsigned_int,_true,_true> *)
        &(this->options).numThreads.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>;
  local_118.singleUnit =
       (bool)((this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_payload._M_value != false &
             (this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
             super__Optional_payload_base<bool>._M_engaged);
  local_d0._0_4_ = 0x40;
  local_e8 = bag;
  pmVar16 = std::
            map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
            ::at(&(this->options).compilationFlags,(key_type *)local_d0);
  local_118.onlyLint =
       (bool)((pmVar16->super__Optional_base<bool,_true,_true>)._M_payload.
              super__Optional_payload_base<bool>._M_payload._M_value != false &
             (pmVar16->super__Optional_base<bool,_true,_true>)._M_payload.
             super__Optional_payload_base<bool>._M_engaged);
  local_118.librariesInheritMacros =
       (bool)((this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>.
              _M_payload.super__Optional_payload_base<bool>._M_payload._M_value != false &
             (this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>.
             _M_payload.super__Optional_payload_base<bool>._M_engaged);
  local_d0._0_4_ = 0x400;
  local_d0._4_4_ = Default;
  local_d0._8_8_ = local_d0 + 0x18;
  local_d0._24_4_ = 0x6970613c;
  local_d0._28_2_ = 0x3e;
  local_d0._16_8_ = 5;
  local_a8._0_16_ = (undefined1  [16])0x0;
  stack0xffffffffffffff68 = (undefined1  [16])0x0;
  auStack_90._8_16_ = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (pointer)0x0;
  local_60 = 0x3f;
  local_58 = (basic_string_view<char,_std::char_traits<char>_> *)0x1;
  local_50 = ZEXT816(0x49b460);
  local_40 = 0;
  local_38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,&(this->options).defines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_90,&(this->options).undefines);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_d0 + 8),0,
             local_d0._16_8_,"<command-line>",0xe);
  if ((this->options).maxIncludeDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    local_d0._0_4_ =
         (this->options).maxIncludeDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload._M_value;
  }
  local_d0._4_4_ = this->languageVersion;
  pbVar25 = (this->options).ignoreDirectives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_140 = (this->options).ignoreDirectives.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = this;
  if (pbVar25 != local_140) {
    do {
      pcVar9 = (char *)((basic_string_view<char,_std::char_traits<char>_> *)&pbVar25->_M_dataplus)->
                       _M_len;
      len = (ParserOptions)pbVar25->_M_string_length;
      local_210._0_8_ = len;
      local_210._8_8_ = pcVar9;
      local_108 = (char *)detail::hashing::hash(pcVar9,(size_t)len);
      ppVar26 = (value_type_pointer)((ulong)local_108 >> ((byte)local_60._0_1_ & 0x3f));
      lVar33 = ((ulong)local_108 & 0xff) * 4;
      uVar39 = (&UNK_0049b57c)[lVar33];
      uVar44 = (&UNK_0049b57d)[lVar33];
      uVar46 = (&UNK_0049b57e)[lVar33];
      uVar48 = (&UNK_0049b57f)[lVar33];
      local_1b8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)local_50._8_8_;
      pgVar27 = (group_type_pointer)(ulong)((uint)local_108 & 7);
      local_150 = local_58;
      pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      pgVar30 = (group_type_pointer)local_50._0_8_;
      uVar59 = uVar39;
      uVar60 = uVar44;
      uVar61 = uVar46;
      uVar62 = uVar48;
      uVar63 = uVar39;
      uVar64 = uVar44;
      uVar65 = uVar46;
      uVar66 = uVar48;
      uVar67 = uVar39;
      uVar68 = uVar44;
      uVar69 = uVar46;
      uVar70 = uVar48;
      local_f8 = ppVar26;
      do {
        ppVar21 = local_1b8;
        pgVar2 = pgVar30 + (long)ppVar26;
        auVar40[0] = -(pgVar2->m[0].n == uVar39);
        auVar40[1] = -(pgVar2->m[1].n == uVar44);
        auVar40[2] = -(pgVar2->m[2].n == uVar46);
        auVar40[3] = -(pgVar2->m[3].n == uVar48);
        auVar40[4] = -(pgVar2->m[4].n == uVar59);
        auVar40[5] = -(pgVar2->m[5].n == uVar60);
        auVar40[6] = -(pgVar2->m[6].n == uVar61);
        auVar40[7] = -(pgVar2->m[7].n == uVar62);
        auVar40[8] = -(pgVar2->m[8].n == uVar63);
        auVar40[9] = -(pgVar2->m[9].n == uVar64);
        auVar40[10] = -(pgVar2->m[10].n == uVar65);
        auVar40[0xb] = -(pgVar2->m[0xb].n == uVar66);
        auVar40[0xc] = -(pgVar2->m[0xc].n == uVar67);
        auVar40[0xd] = -(pgVar2->m[0xd].n == uVar68);
        auVar40[0xe] = -(pgVar2->m[0xe].n == uVar69);
        auVar40[0xf] = -(pgVar2->m[0xf].n == uVar70);
        uVar34 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
        pbVar22 = (pointer)pbVar29;
        ptVar32 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                   *)((long)ppVar26 * 0x10);
        local_160 = ppVar26;
        if (uVar34 != 0) {
          local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)CONCAT17(uVar62,CONCAT16(uVar61,CONCAT15(uVar60,CONCAT14(uVar59,CONCAT13(
                                                  uVar48,CONCAT12(uVar46,CONCAT11(uVar44,uVar39)))))
                                                 ));
          uStack_1e0 = uVar63;
          uStack_1df = uVar64;
          uStack_1de = uVar65;
          uStack_1dd = uVar66;
          uStack_1dc = uVar67;
          uStack_1db = uVar68;
          uStack_1da = uVar69;
          uStack_1d9 = uVar70;
          local_170 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                       *)((long)ppVar26 * 0x10);
          local_168 = pbVar25;
          local_158 = (pointer)pbVar29;
          local_128 = pgVar27;
          local_120 = pgVar30;
          do {
            iVar15 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            bVar37 = len == *(ParserOptions *)
                             ((long)ppVar21 + (ulong)(uint)(iVar15 << 4) + (long)ppVar26 * 0xf0);
            lVar33 = (long)ppVar21 + (ulong)(uint)(iVar15 << 4) + (long)ppVar26 * 0xf0;
            if (bVar37 && len != (ParserOptions)0x0) {
              iVar15 = bcmp(pcVar9,*(void **)(lVar33 + 8),(size_t)len);
              bVar37 = iVar15 == 0;
              uVar39 = (uchar)local_1e8;
              uVar44 = local_1e8._1_1_;
              uVar46 = local_1e8._2_1_;
              uVar48 = local_1e8._3_1_;
              uVar59 = local_1e8._4_1_;
              uVar60 = local_1e8._5_1_;
              uVar61 = local_1e8._6_1_;
              uVar62 = local_1e8._7_1_;
              uVar63 = uStack_1e0;
              uVar64 = uStack_1df;
              uVar65 = uStack_1de;
              uVar66 = uStack_1dd;
              uVar67 = uStack_1dc;
              uVar68 = uStack_1db;
              uVar69 = uStack_1da;
              uVar70 = uStack_1d9;
            }
            pbVar25 = local_168;
            if (bVar37) goto LAB_001dbad9;
            uVar34 = uVar34 - 1 & uVar34;
            pgVar27 = local_128;
            pbVar22 = local_158;
            pgVar30 = local_120;
            ptVar32 = local_170;
          } while (uVar34 != 0);
        }
        if (((byte)(ptVar32 + (long)pgVar30)[0xf] &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(long)pgVar27]) == 0) break;
        pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                  ((slot_type *)
                   &((basic_string_view<char,_std::char_traits<char>_> *)pbVar22)->_M_len + 1);
        ppVar26 = (value_type_pointer)
                  ((ulong)((slot_type *)
                           &((basic_string_view<char,_std::char_traits<char>_> *)pbVar22)->_M_len +
                          (long)((long)&(local_160->first)._M_len + 1)) & (ulong)local_150);
      } while (pbVar29 <= local_150);
      lVar33 = 0;
LAB_001dbad9:
      this = local_1c0;
      if (lVar33 == 0) {
        if (local_38 < local_40) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)local_1b0,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&local_60,(arrays_type *)&local_60,(size_t)local_f8,(size_t)local_108,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_210);
          local_38 = local_38 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)local_1b0,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&local_60,(size_t)local_108,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_210);
        }
      }
      pbVar25 = pbVar25 + 1;
    } while (pbVar25 != local_140);
  }
  local_1b0._0_8_ = (group15<boost::unordered::detail::foa::plain_integral> *)0x3f;
  local_1b0._8_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x1;
  stack0xfffffffffffffe60 = ZEXT816(0x49b460);
  local_190 = 0;
  local_188 = 0;
  local_180 = 0x10;
  local_178 = (bool)((this->options).enableLegacyProtect.super__Optional_base<bool,_true,_true>.
                     _M_payload.super__Optional_payload_base<bool>._M_payload._M_value != false &
                    (this->options).enableLegacyProtect.super__Optional_base<bool,_true,_true>.
                    _M_payload.super__Optional_payload_base<bool>._M_engaged);
  if ((this->options).maxLexerErrors.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged != false) {
    local_180 = (this->options).maxLexerErrors.super__Optional_base<unsigned_int,_true,_true>.
                _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value;
  }
  LStack_17c = this->languageVersion;
  if (local_178 != false) {
    local_1d0._M_len = 6;
    local_1d0._M_str = "pragma";
    uVar17 = detail::hashing::hash("pragma",6);
    uVar20 = uVar17 >> 0x3f;
    uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar17 & 0xff];
    ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)0x0;
    do {
      lVar33 = uVar20 * 0x10;
      cVar38 = (char)uVar4;
      auVar49[0] = -((&boost::unordered::detail::foa::
                       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                       ::storage)[lVar33] == cVar38);
      cVar43 = (char)((uint)uVar4 >> 8);
      auVar49[1] = -((&DAT_0049b461)[lVar33] == cVar43);
      cVar45 = (char)((uint)uVar4 >> 0x10);
      auVar49[2] = -((&DAT_0049b462)[lVar33] == cVar45);
      cVar47 = (char)((uint)uVar4 >> 0x18);
      auVar49[3] = -((&DAT_0049b463)[lVar33] == cVar47);
      auVar49[4] = -((&DAT_0049b464)[lVar33] == cVar38);
      auVar49[5] = -((&DAT_0049b465)[lVar33] == cVar43);
      auVar49[6] = -((&UNK_0049b466)[lVar33] == cVar45);
      auVar49[7] = -((&UNK_0049b467)[lVar33] == cVar47);
      auVar49[8] = -((&UNK_0049b468)[lVar33] == cVar38);
      auVar49[9] = -((&UNK_0049b469)[lVar33] == cVar43);
      auVar49[10] = -((&UNK_0049b46a)[lVar33] == cVar45);
      auVar49[0xb] = -((&UNK_0049b46b)[lVar33] == cVar47);
      auVar49[0xc] = -((&UNK_0049b46c)[lVar33] == cVar38);
      auVar49[0xd] = -((&UNK_0049b46d)[lVar33] == cVar43);
      auVar49[0xe] = -((&UNK_0049b46e)[lVar33] == cVar45);
      auVar49[0xf] = -((&DAT_0049b46f)[lVar33] == cVar47);
      uVar34 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe);
      if (uVar34 != 0) {
        do {
          iVar15 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
            }
          }
          ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)(uVar20 * 0x3c0 + (ulong)(uint)(iVar15 << 6));
          if (*(long *)(uVar20 * 0x3c0 + (ulong)(uint)(iVar15 << 6)) == 6) {
            piVar5 = (int *)(ppVar18->first)._M_str;
            bVar37 = (short)piVar5[1] == 0x616d && *piVar5 == 0x67617270;
          }
          else {
            bVar37 = false;
          }
          this = local_1c0;
          local_1e8 = ppVar21;
          if (bVar37) goto LAB_001daaa2;
          uVar34 = uVar34 - 1 & uVar34;
        } while (uVar34 != 0);
      }
      if (((&DAT_0049b46f)[lVar33] &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
      ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)((long)&(ppVar21->first)._M_len + 1);
      uVar20 = (ulong)((int)uVar20 + (int)ppVar21 & 1);
    } while (ppVar21 !=
             (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
              *)0x2);
    ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)0x0;
LAB_001daaa2:
    if (ppVar18 ==
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
         *)0x0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,uVar17,(try_emplace_args_t *)&local_1f8,&local_1d0);
      ppVar18 = local_200;
    }
    puVar1 = &ppVar18->second;
    local_1f8._M_len = 7;
    local_1f8._M_str = "protect";
    uVar17 = detail::hashing::hash("protect",7);
    uVar31 = uVar17 >> ((char)*(Kind *)&(ppVar18->second).table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                        .arrays.groups_size_index & 0x3f);
    pgVar27 = (ppVar18->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .arrays.groups_;
    uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar17 & 0xff];
    ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)0x0;
    uVar20 = uVar31;
    do {
      pgVar28 = pgVar27 + uVar20;
      uVar39 = (uchar)uVar4;
      auVar50[0] = -(pgVar28->m[0].n == uVar39);
      uVar44 = (uchar)((uint)uVar4 >> 8);
      auVar50[1] = -(pgVar28->m[1].n == uVar44);
      uVar46 = (uchar)((uint)uVar4 >> 0x10);
      auVar50[2] = -(pgVar28->m[2].n == uVar46);
      uVar48 = (uchar)((uint)uVar4 >> 0x18);
      auVar50[3] = -(pgVar28->m[3].n == uVar48);
      auVar50[4] = -(pgVar28->m[4].n == uVar39);
      auVar50[5] = -(pgVar28->m[5].n == uVar44);
      auVar50[6] = -(pgVar28->m[6].n == uVar46);
      auVar50[7] = -(pgVar28->m[7].n == uVar48);
      auVar50[8] = -(pgVar28->m[8].n == uVar39);
      auVar50[9] = -(pgVar28->m[9].n == uVar44);
      auVar50[10] = -(pgVar28->m[10].n == uVar46);
      auVar50[0xb] = -(pgVar28->m[0xb].n == uVar48);
      auVar50[0xc] = -(pgVar28->m[0xc].n == uVar39);
      auVar50[0xd] = -(pgVar28->m[0xd].n == uVar44);
      auVar50[0xe] = -(pgVar28->m[0xe].n == uVar46);
      auVar50[0xf] = -(pgVar28->m[0xf].n == uVar48);
      uVar34 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe);
      if (uVar34 != 0) {
        do {
          uVar19 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)((ppVar18->second).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                        .arrays.elements_ + uVar20 * 0xf + (ulong)uVar19);
          if ((ppVar36->first)._M_len == 7) {
            piVar5 = (int *)(ppVar36->first)._M_str;
            bVar37 = *(int *)((long)piVar5 + 3) == 0x74636574 && *piVar5 == 0x746f7270;
          }
          else {
            bVar37 = false;
          }
          this = local_1c0;
          local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)puVar1;
          local_1b8 = ppVar21;
          if (bVar37) goto LAB_001dac0e;
          uVar34 = uVar34 - 1 & uVar34;
        } while (uVar34 != 0);
      }
      if ((pgVar27[uVar20].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
      ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)((string_view *)
                   &(ppVar18->second).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                    .arrays.groups_size_mask)->_M_len;
      pbVar29 = &ppVar21->first;
      ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)((long)&(ppVar21->first)._M_len + 1);
      uVar20 = (long)&pbVar29->_M_len + uVar20 + 1 & (ulong)ppVar36;
    } while (ppVar21 <= ppVar36);
    ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)0x0;
LAB_001dac0e:
    if (ppVar36 ==
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
         *)0x0) {
      if ((ppVar18->second).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
          .size_ctrl.size <
          (ppVar18->second).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                  ((locator *)local_210,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                    *)puVar1,(arrays_type *)puVar1,uVar31,uVar17,&local_211,&local_1f8);
        psVar12 = &(ppVar18->second).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                   .size_ctrl.size;
        *psVar12 = *psVar12 + 1;
        ppVar36 = local_200;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                  ((locator *)local_210,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                    *)puVar1,uVar17,&local_211,&local_1f8);
        ppVar36 = local_200;
      }
    }
    *(Kind *)&(ppVar36->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .arrays.groups_size_index = Protect;
    ptVar13 = &(ppVar36->second).table_;
    (ptVar13->
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    ).arrays.groups_size_mask = 0;
    (ptVar13->
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    ).arrays.groups_ = (group_type_pointer)0x0;
  }
  pbVar25 = (pointer)(this->translateOffFormats).
                     super__Vector_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (pointer)(this->translateOffFormats).
                      super__Vector_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar25 != local_d8) {
    do {
      local_158 = pbVar25 + 1;
      local_140 = (pointer)&pbVar25->field_2;
      local_120 = (group_type_pointer)
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&pbVar25->_M_dataplus)->_M_allocated_capacity;
      local_128 = (group_type_pointer)pbVar25->_M_string_length;
      sVar8 = ((basic_string_view<char,_std::char_traits<char>_> *)&pbVar25[1]._M_dataplus)->_M_len;
      pcVar9 = (char *)pbVar25[1]._M_string_length;
      local_170 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                   *)detail::hashing::hash(pcVar9,sVar8);
      pgVar27 = (group_type_pointer)((ulong)local_170 >> ((byte)local_1b0[0] & 0x3f));
      lVar33 = ((ulong)local_170 & 0xff) * 4;
      uVar39 = (&UNK_0049b57c)[lVar33];
      uVar44 = (&UNK_0049b57d)[lVar33];
      uVar46 = (&UNK_0049b57e)[lVar33];
      uVar48 = (&UNK_0049b57f)[lVar33];
      local_f8 = ppStack_198;
      ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)(ulong)((uint)local_170 & 7);
      local_e0 = (basic_string_view<char,_std::char_traits<char>_> *)local_1b0._8_8_;
      pbVar23 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)local_1b0._16_8_;
      uVar59 = uVar39;
      uVar60 = uVar44;
      uVar61 = uVar46;
      uVar62 = uVar48;
      uVar63 = uVar39;
      uVar64 = uVar44;
      uVar65 = uVar46;
      uVar66 = uVar48;
      uVar67 = uVar39;
      uVar68 = uVar44;
      uVar69 = uVar46;
      uVar70 = uVar48;
      local_168 = pbVar25;
      local_160 = (value_type_pointer)pgVar27;
      do {
        ppVar26 = local_f8;
        pbVar24 = pbVar29 + (long)pgVar27;
        auVar41[0] = -(((slot_type *)&pbVar24->_M_len)->n == uVar39);
        auVar41[1] = -(((slot_type *)&pbVar24->_M_len)[1].n == uVar44);
        auVar41[2] = -(((slot_type *)&pbVar24->_M_len)[2].n == uVar46);
        auVar41[3] = -(((slot_type *)&pbVar24->_M_len)[3].n == uVar48);
        auVar41[4] = -(((slot_type *)&pbVar24->_M_len)[4].n == uVar59);
        auVar41[5] = -(((slot_type *)&pbVar24->_M_len)[5].n == uVar60);
        auVar41[6] = -(((slot_type *)&pbVar24->_M_len)[6].n == uVar61);
        auVar41[7] = -(((slot_type *)&pbVar24->_M_len)[7].n == uVar62);
        auVar41[8] = -(*(uchar *)&pbVar24->_M_str == uVar63);
        auVar41[9] = -(((slot_type *)((long)&pbVar24->_M_str + 1))->n == uVar64);
        auVar41[10] = -(((slot_type *)((long)&pbVar24->_M_str + 2))->n == uVar65);
        auVar41[0xb] = -(((slot_type *)((long)&pbVar24->_M_str + 3))->n == uVar66);
        auVar41[0xc] = -(((slot_type *)((long)&pbVar24->_M_str + 4))->n == uVar67);
        auVar41[0xd] = -(((slot_type *)((long)&pbVar24->_M_str + 5))->n == uVar68);
        auVar41[0xe] = -(((slot_type *)((long)&pbVar24->_M_str + 6))->n == uVar69);
        auVar41[0xf] = -(((slot_type *)((long)&pbVar24->_M_str + 7))->n == uVar70);
        uVar34 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
        pbVar24 = pbVar23;
        pgVar28 = pgVar27;
        if (uVar34 != 0) {
          local_108 = (char *)CONCAT17(uVar62,CONCAT16(uVar61,CONCAT15(uVar60,CONCAT14(uVar59,
                                                  CONCAT13(uVar48,CONCAT12(uVar46,CONCAT11(uVar44,
                                                  uVar39)))))));
          local_150 = pbVar29;
          local_148 = ppVar21;
          local_138 = pbVar23;
          local_130 = pgVar27;
          uStack_100 = uVar63;
          uStack_ff = uVar64;
          uStack_fe = uVar65;
          uStack_fd = uVar66;
          uStack_fc = uVar67;
          uStack_fb = uVar68;
          uStack_fa = uVar69;
          uStack_f9 = uVar70;
          do {
            iVar15 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            bVar37 = sVar8 == *(size_t *)
                               ((long)&ppVar26[(long)pgVar27 * 0xf].first._M_len +
                               (ulong)(uint)(iVar15 << 6));
            ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)((long)&ppVar26[(long)pgVar27 * 0xf].first._M_len +
                         (ulong)(uint)(iVar15 << 6));
            if (bVar37 && sVar8 != 0) {
              iVar15 = bcmp(pcVar9,(ppVar21->first)._M_str,sVar8);
              bVar37 = iVar15 == 0;
              uVar39 = (uchar)local_108;
              uVar44 = local_108._1_1_;
              uVar46 = local_108._2_1_;
              uVar48 = local_108._3_1_;
              uVar59 = local_108._4_1_;
              uVar60 = local_108._5_1_;
              uVar61 = local_108._6_1_;
              uVar62 = local_108._7_1_;
              uVar63 = uStack_100;
              uVar64 = uStack_ff;
              uVar65 = uStack_fe;
              uVar66 = uStack_fd;
              uVar67 = uStack_fc;
              uVar68 = uStack_fb;
              uVar69 = uStack_fa;
              uVar70 = uStack_f9;
            }
            pbVar25 = local_168;
            if (bVar37) goto LAB_001dbd34;
            uVar34 = uVar34 - 1 & uVar34;
            ppVar21 = local_148;
            pbVar24 = local_138;
            pgVar28 = local_130;
            pbVar29 = local_150;
          } while (uVar34 != 0);
        }
        if ((((slot_type *)((long)&pbVar29[(long)pgVar27]._M_str + 7))->n &
            (byte)ppVar21[0x126e5].second.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                  .size_ctrl.ml) == 0) break;
        pbVar23 = (basic_string_view<char,_std::char_traits<char>_> *)
                  ((slot_type *)&pbVar24->_M_len + 1);
        pgVar27 = (group_type_pointer)
                  ((ulong)((slot_type *)&pbVar24->_M_len + (long)(pgVar28->m + 1)) & (ulong)local_e0
                  );
      } while (pbVar23 <= local_e0);
      local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)0x0;
      ppVar21 = local_1e8;
LAB_001dbd34:
      local_1e8 = ppVar21;
      ppVar21 = local_1e8;
      if (local_1e8 ==
          (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
           *)0x0) {
        if (local_188 < local_190) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)local_210,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                      *)local_1b0,(arrays_type *)local_1b0,(size_t)local_160,(size_t)local_170,
                     (try_emplace_args_t *)&local_1d0,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_158);
          local_188 = local_188 + 1;
          ppVar21 = local_200;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)local_210,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                      *)local_1b0,(size_t)local_170,(try_emplace_args_t *)&local_1d0,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_158);
          ppVar21 = local_200;
        }
      }
      local_170 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                   *)&ppVar21->second;
      sVar8 = (pbVar25->field_2)._M_allocated_capacity;
      local_108 = *(char **)((long)&pbVar25->field_2 + 8);
      local_160 = (value_type_pointer)detail::hashing::hash(local_108,sVar8);
      pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                ((ulong)local_160 >>
                ((char)*(Kind *)&(ppVar21->second).table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                 .arrays.groups_size_index & 0x3f));
      pgVar27 = (ppVar21->second).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                .arrays.groups_;
      lVar33 = ((ulong)local_160 & 0xff) * 4;
      uVar39 = (&UNK_0049b57c)[lVar33];
      uVar44 = (&UNK_0049b57d)[lVar33];
      uVar46 = (&UNK_0049b57e)[lVar33];
      uVar48 = (&UNK_0049b57f)[lVar33];
      uVar34 = (uint)local_160;
      uVar20 = 0;
      uVar59 = uVar39;
      uVar60 = uVar44;
      uVar61 = uVar46;
      uVar62 = uVar48;
      uVar63 = uVar39;
      uVar64 = uVar44;
      uVar65 = uVar46;
      uVar66 = uVar48;
      uVar67 = uVar39;
      uVar68 = uVar44;
      uVar69 = uVar46;
      uVar70 = uVar48;
      local_150 = pbVar29;
      do {
        local_158 = (pointer)((long)pbVar29 * 0x10);
        psVar3 = (slot_type *)
                 &((basic_string_view<char,_std::char_traits<char>_> *)local_158)->_M_len +
                 (long)pgVar27;
        auVar42[0] = -(psVar3->n == uVar39);
        auVar42[1] = -(psVar3[1].n == uVar44);
        auVar42[2] = -(psVar3[2].n == uVar46);
        auVar42[3] = -(psVar3[3].n == uVar48);
        auVar42[4] = -(psVar3[4].n == uVar59);
        auVar42[5] = -(psVar3[5].n == uVar60);
        auVar42[6] = -(psVar3[6].n == uVar61);
        auVar42[7] = -(psVar3[7].n == uVar62);
        auVar42[8] = -(psVar3[8].n == uVar63);
        auVar42[9] = -(psVar3[9].n == uVar64);
        auVar42[10] = -(psVar3[10].n == uVar65);
        auVar42[0xb] = -(psVar3[0xb].n == uVar66);
        auVar42[0xc] = -(psVar3[0xc].n == uVar67);
        auVar42[0xd] = -(psVar3[0xd].n == uVar68);
        auVar42[0xe] = -(psVar3[0xe].n == uVar69);
        auVar42[0xf] = -(psVar3[0xf].n == uVar70);
        uVar19 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
        local_138 = pbVar29;
        if (uVar19 != 0) {
          ppVar10 = (ppVar21->second).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                    .arrays.elements_;
          local_f8 = (value_type_pointer)
                     CONCAT17(uVar62,CONCAT16(uVar61,CONCAT15(uVar60,CONCAT14(uVar59,CONCAT13(uVar48
                                                  ,CONCAT12(uVar46,CONCAT11(uVar44,uVar39)))))));
          local_148 = ppVar21;
          local_130 = pgVar27;
          uStack_f0 = uVar63;
          uStack_ef = uVar64;
          uStack_ee = uVar65;
          uStack_ed = uVar66;
          uStack_ec = uVar67;
          uStack_eb = uVar68;
          uStack_ea = uVar69;
          uStack_e9 = uVar70;
          do {
            uVar11 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)(ppVar10 + (long)pbVar29 * 0xf + (ulong)uVar11);
            bVar37 = sVar8 == (ppVar18->first)._M_len;
            if (bVar37 && sVar8 != 0) {
              iVar15 = bcmp(local_108,(ppVar18->first)._M_str,sVar8);
              bVar37 = iVar15 == 0;
              uVar39 = (uchar)local_f8;
              uVar44 = local_f8._1_1_;
              uVar46 = local_f8._2_1_;
              uVar48 = local_f8._3_1_;
              uVar59 = local_f8._4_1_;
              uVar60 = local_f8._5_1_;
              uVar61 = local_f8._6_1_;
              uVar62 = local_f8._7_1_;
              uVar63 = uStack_f0;
              uVar64 = uStack_ef;
              uVar65 = uStack_ee;
              uVar66 = uStack_ed;
              uVar67 = uStack_ec;
              uVar68 = uStack_eb;
              uVar69 = uStack_ea;
              uVar70 = uStack_e9;
            }
            pbVar25 = local_168;
            ppVar21 = local_148;
            if (bVar37) goto LAB_001dbf1b;
            uVar19 = uVar19 - 1 & uVar19;
            pgVar27 = local_130;
          } while (uVar19 != 0);
        }
        if ((((slot_type *)((long)&local_158->_M_string_length + (long)(pgVar27->m + 7)))->n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[uVar34 & 7]) == 0) break;
        uVar31 = ((string_view *)
                 &(ppVar21->second).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                  .arrays.groups_size_mask)->_M_len;
        lVar33 = uVar20 + 1;
        uVar20 = uVar20 + 1;
        pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                  ((ulong)((long)&local_138->_M_len + lVar33) & uVar31);
      } while (uVar20 <= uVar31);
      local_1b8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)0x0;
      ppVar18 = local_1b8;
LAB_001dbf1b:
      local_1b8 = ppVar18;
      ppVar18 = local_1b8;
      if (local_1b8 ==
          (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
           *)0x0) {
        if ((ppVar21->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .size_ctrl.size <
            (ppVar21->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)local_210,local_170,(arrays_type *)local_170,(size_t)local_150,
                     (size_t)local_160,(try_emplace_args_t *)&local_1d0,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_140);
          psVar12 = &(ppVar21->second).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                     .size_ctrl.size;
          *psVar12 = *psVar12 + 1;
          ppVar18 = local_200;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                    ((locator *)local_210,local_170,(size_t)local_160,
                     (try_emplace_args_t *)&local_1d0,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_140);
          ppVar18 = local_200;
        }
      }
      *(Kind *)&(ppVar18->second).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                .arrays.groups_size_index = TranslateOff;
      ((string_view *)
      &(ppVar18->second).table_.
       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
       .arrays.groups_size_mask)->_M_len = (size_t)local_120;
      (ppVar18->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .arrays.groups_ = local_128;
      pbVar25 = (pointer)&pbVar25[1].field_2;
    } while (pbVar25 != local_d8);
  }
  local_1d0._M_len = 5;
  local_1d0._M_str = "slang";
  uVar17 = detail::hashing::hash("slang",5);
  uVar31 = uVar17 >> ((byte)local_1b0[0] & 0x3f);
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar17 & 0xff];
  local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)local_1b0._8_8_;
  pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  uVar20 = uVar31;
  do {
    pbVar23 = (basic_string_view<char,_std::char_traits<char>_> *)(local_1b0._16_8_ + uVar20 * 0x10)
    ;
    uVar39 = (uchar)uVar4;
    auVar51[0] = -(((slot_type *)&pbVar23->_M_len)->n == uVar39);
    uVar44 = (uchar)((uint)uVar4 >> 8);
    auVar51[1] = -(((slot_type *)&pbVar23->_M_len)[1].n == uVar44);
    uVar46 = (uchar)((uint)uVar4 >> 0x10);
    auVar51[2] = -(((slot_type *)&pbVar23->_M_len)[2].n == uVar46);
    uVar48 = (uchar)((uint)uVar4 >> 0x18);
    auVar51[3] = -(((slot_type *)&pbVar23->_M_len)[3].n == uVar48);
    auVar51[4] = -(((slot_type *)&pbVar23->_M_len)[4].n == uVar39);
    auVar51[5] = -(((slot_type *)&pbVar23->_M_len)[5].n == uVar44);
    auVar51[6] = -(((slot_type *)&pbVar23->_M_len)[6].n == uVar46);
    auVar51[7] = -(((slot_type *)&pbVar23->_M_len)[7].n == uVar48);
    auVar51[8] = -(*(uchar *)&pbVar23->_M_str == uVar39);
    auVar51[9] = -(((slot_type *)((long)&pbVar23->_M_str + 1))->n == uVar44);
    auVar51[10] = -(((slot_type *)((long)&pbVar23->_M_str + 2))->n == uVar46);
    auVar51[0xb] = -(((slot_type *)((long)&pbVar23->_M_str + 3))->n == uVar48);
    auVar51[0xc] = -(((slot_type *)((long)&pbVar23->_M_str + 4))->n == uVar39);
    auVar51[0xd] = -(((slot_type *)((long)&pbVar23->_M_str + 5))->n == uVar44);
    auVar51[0xe] = -(((slot_type *)((long)&pbVar23->_M_str + 6))->n == uVar46);
    auVar51[0xf] = -(((slot_type *)((long)&pbVar23->_M_str + 7))->n == uVar48);
    for (uVar34 = (uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe); uVar34 != 0;
        uVar34 = uVar34 - 1 & uVar34) {
      iVar15 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
        }
      }
      ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)((long)&ppStack_198[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar15 << 6));
      if (*(long *)((long)&ppStack_198[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar15 << 6)) == 5
         ) {
        piVar5 = (int *)(ppVar21->first)._M_str;
        bVar37 = (char)piVar5[1] == 'g' && *piVar5 == 0x6e616c73;
      }
      else {
        bVar37 = false;
      }
      if (bVar37) goto LAB_001dadb0;
    }
    if ((((slot_type *)
         ((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                 (local_1b0._16_8_ + uVar20 * 0x10))->_M_str + 7))->n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    psVar12 = &pbVar29->_M_len;
    pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&pbVar29->_M_len + 1);
    uVar20 = (ulong)((long)psVar12 + uVar20 + 1) & local_1b0._8_8_;
  } while (pbVar29 <= (ulong)local_1b0._8_8_);
  ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
LAB_001dadb0:
  if (ppVar21 ==
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
       *)0x0) {
    if (local_188 < local_190) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,(arrays_type *)local_1b0,uVar31,uVar17,
                 (try_emplace_args_t *)&local_1f8,&local_1d0);
      local_188 = local_188 + 1;
      ppVar21 = local_200;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,uVar17,(try_emplace_args_t *)&local_1f8,&local_1d0);
      ppVar21 = local_200;
    }
  }
  puVar1 = &ppVar21->second;
  local_1f8._M_len = 8;
  local_1f8._M_str = "lint_off";
  uVar17 = detail::hashing::hash("lint_off",8);
  uVar31 = uVar17 >> ((char)*(Kind *)&(ppVar21->second).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                      .arrays.groups_size_index & 0x3f);
  pgVar27 = (ppVar21->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar17 & 0xff];
  uVar35 = 0;
  uVar20 = uVar31;
  do {
    pgVar28 = pgVar27 + uVar20;
    uVar39 = (uchar)uVar4;
    auVar52[0] = -(pgVar28->m[0].n == uVar39);
    uVar44 = (uchar)((uint)uVar4 >> 8);
    auVar52[1] = -(pgVar28->m[1].n == uVar44);
    uVar46 = (uchar)((uint)uVar4 >> 0x10);
    auVar52[2] = -(pgVar28->m[2].n == uVar46);
    uVar48 = (uchar)((uint)uVar4 >> 0x18);
    auVar52[3] = -(pgVar28->m[3].n == uVar48);
    auVar52[4] = -(pgVar28->m[4].n == uVar39);
    auVar52[5] = -(pgVar28->m[5].n == uVar44);
    auVar52[6] = -(pgVar28->m[6].n == uVar46);
    auVar52[7] = -(pgVar28->m[7].n == uVar48);
    auVar52[8] = -(pgVar28->m[8].n == uVar39);
    auVar52[9] = -(pgVar28->m[9].n == uVar44);
    auVar52[10] = -(pgVar28->m[10].n == uVar46);
    auVar52[0xb] = -(pgVar28->m[0xb].n == uVar48);
    auVar52[0xc] = -(pgVar28->m[0xc].n == uVar39);
    auVar52[0xd] = -(pgVar28->m[0xd].n == uVar44);
    auVar52[0xe] = -(pgVar28->m[0xe].n == uVar46);
    auVar52[0xf] = -(pgVar28->m[0xf].n == uVar48);
    uVar34 = (uint)(ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe);
    if (uVar34 != 0) {
      do {
        uVar19 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)((ppVar21->second).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                      .arrays.elements_ + uVar20 * 0xf + (ulong)uVar19);
        if ((ppVar18->first)._M_len == 8) {
          bVar37 = *(long *)(ppVar18->first)._M_str == 0x66666f5f746e696c;
        }
        else {
          bVar37 = false;
        }
        if (bVar37) goto LAB_001daf0c;
        uVar34 = uVar34 - 1 & uVar34;
      } while (uVar34 != 0);
    }
    if ((pgVar27[uVar20].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    uVar6 = ((string_view *)
            &(ppVar21->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_size_mask)->_M_len;
    lVar33 = uVar20 + uVar35;
    uVar35 = uVar35 + 1;
    uVar20 = lVar33 + 1U & uVar6;
  } while (uVar35 <= uVar6);
  ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
LAB_001daf0c:
  if (ppVar18 ==
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
       *)0x0) {
    if ((ppVar21->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.size <
        (ppVar21->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)puVar1,(arrays_type *)puVar1,uVar31,uVar17,&local_211,&local_1f8);
      psVar12 = &(ppVar21->second).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                 .size_ctrl.size;
      *psVar12 = *psVar12 + 1;
      ppVar18 = local_200;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)puVar1,uVar17,&local_211,&local_1f8);
      ppVar18 = local_200;
    }
  }
  *(Kind *)&(ppVar18->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_size_index = LintOff;
  ptVar13 = &(ppVar18->second).table_;
  (ptVar13->
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  ).arrays.groups_size_mask = 0;
  (ptVar13->
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  ).arrays.groups_ = (group_type_pointer)0x0;
  local_1d0._M_len = 5;
  local_1d0._M_str = "slang";
  uVar17 = detail::hashing::hash("slang",5);
  uVar31 = uVar17 >> ((byte)local_1b0[0] & 0x3f);
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar17 & 0xff];
  local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)local_1b0._8_8_;
  pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  uVar20 = uVar31;
  do {
    pbVar23 = (basic_string_view<char,_std::char_traits<char>_> *)(local_1b0._16_8_ + uVar20 * 0x10)
    ;
    uVar39 = (uchar)uVar4;
    auVar53[0] = -(((slot_type *)&pbVar23->_M_len)->n == uVar39);
    uVar44 = (uchar)((uint)uVar4 >> 8);
    auVar53[1] = -(((slot_type *)&pbVar23->_M_len)[1].n == uVar44);
    uVar46 = (uchar)((uint)uVar4 >> 0x10);
    auVar53[2] = -(((slot_type *)&pbVar23->_M_len)[2].n == uVar46);
    uVar48 = (uchar)((uint)uVar4 >> 0x18);
    auVar53[3] = -(((slot_type *)&pbVar23->_M_len)[3].n == uVar48);
    auVar53[4] = -(((slot_type *)&pbVar23->_M_len)[4].n == uVar39);
    auVar53[5] = -(((slot_type *)&pbVar23->_M_len)[5].n == uVar44);
    auVar53[6] = -(((slot_type *)&pbVar23->_M_len)[6].n == uVar46);
    auVar53[7] = -(((slot_type *)&pbVar23->_M_len)[7].n == uVar48);
    auVar53[8] = -(*(uchar *)&pbVar23->_M_str == uVar39);
    auVar53[9] = -(((slot_type *)((long)&pbVar23->_M_str + 1))->n == uVar44);
    auVar53[10] = -(((slot_type *)((long)&pbVar23->_M_str + 2))->n == uVar46);
    auVar53[0xb] = -(((slot_type *)((long)&pbVar23->_M_str + 3))->n == uVar48);
    auVar53[0xc] = -(((slot_type *)((long)&pbVar23->_M_str + 4))->n == uVar39);
    auVar53[0xd] = -(((slot_type *)((long)&pbVar23->_M_str + 5))->n == uVar44);
    auVar53[0xe] = -(((slot_type *)((long)&pbVar23->_M_str + 6))->n == uVar46);
    auVar53[0xf] = -(((slot_type *)((long)&pbVar23->_M_str + 7))->n == uVar48);
    for (uVar34 = (uint)(ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe); uVar34 != 0;
        uVar34 = uVar34 - 1 & uVar34) {
      iVar15 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
        }
      }
      ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)((long)&ppStack_198[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar15 << 6));
      if (*(long *)((long)&ppStack_198[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar15 << 6)) == 5
         ) {
        piVar5 = (int *)(ppVar21->first)._M_str;
        bVar37 = (char)piVar5[1] == 'g' && *piVar5 == 0x6e616c73;
      }
      else {
        bVar37 = false;
      }
      if (bVar37) goto LAB_001db086;
    }
    if ((((slot_type *)
         ((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                 (local_1b0._16_8_ + uVar20 * 0x10))->_M_str + 7))->n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    psVar12 = &pbVar29->_M_len;
    pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&pbVar29->_M_len + 1);
    uVar20 = (ulong)((long)psVar12 + uVar20 + 1) & local_1b0._8_8_;
  } while (pbVar29 <= (ulong)local_1b0._8_8_);
  ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
LAB_001db086:
  if (ppVar21 ==
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
       *)0x0) {
    if (local_188 < local_190) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,(arrays_type *)local_1b0,uVar31,uVar17,
                 (try_emplace_args_t *)&local_1f8,&local_1d0);
      local_188 = local_188 + 1;
      ppVar21 = local_200;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,uVar17,(try_emplace_args_t *)&local_1f8,&local_1d0);
      ppVar21 = local_200;
    }
  }
  puVar1 = &ppVar21->second;
  local_1f8._M_len = 7;
  local_1f8._M_str = "lint_on";
  uVar17 = detail::hashing::hash("lint_on",7);
  uVar31 = uVar17 >> ((char)*(Kind *)&(ppVar21->second).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                      .arrays.groups_size_index & 0x3f);
  pgVar27 = (ppVar21->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar17 & 0xff];
  ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
  uVar20 = uVar31;
  do {
    pgVar28 = pgVar27 + uVar20;
    uVar39 = (uchar)uVar4;
    auVar54[0] = -(pgVar28->m[0].n == uVar39);
    uVar44 = (uchar)((uint)uVar4 >> 8);
    auVar54[1] = -(pgVar28->m[1].n == uVar44);
    uVar46 = (uchar)((uint)uVar4 >> 0x10);
    auVar54[2] = -(pgVar28->m[2].n == uVar46);
    uVar48 = (uchar)((uint)uVar4 >> 0x18);
    auVar54[3] = -(pgVar28->m[3].n == uVar48);
    auVar54[4] = -(pgVar28->m[4].n == uVar39);
    auVar54[5] = -(pgVar28->m[5].n == uVar44);
    auVar54[6] = -(pgVar28->m[6].n == uVar46);
    auVar54[7] = -(pgVar28->m[7].n == uVar48);
    auVar54[8] = -(pgVar28->m[8].n == uVar39);
    auVar54[9] = -(pgVar28->m[9].n == uVar44);
    auVar54[10] = -(pgVar28->m[10].n == uVar46);
    auVar54[0xb] = -(pgVar28->m[0xb].n == uVar48);
    auVar54[0xc] = -(pgVar28->m[0xc].n == uVar39);
    auVar54[0xd] = -(pgVar28->m[0xd].n == uVar44);
    auVar54[0xe] = -(pgVar28->m[0xe].n == uVar46);
    auVar54[0xf] = -(pgVar28->m[0xf].n == uVar48);
    uVar34 = (uint)(ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe);
    if (uVar34 != 0) {
      do {
        uVar19 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)((ppVar21->second).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                      .arrays.elements_ + uVar20 * 0xf + (ulong)uVar19);
        if ((ppVar36->first)._M_len == 7) {
          piVar5 = (int *)(ppVar36->first)._M_str;
          bVar37 = *(int *)((long)piVar5 + 3) == 0x6e6f5f74 && *piVar5 == 0x746e696c;
        }
        else {
          bVar37 = false;
        }
        local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)puVar1;
        local_1b8 = ppVar18;
        if (bVar37) goto LAB_001db202;
        uVar34 = uVar34 - 1 & uVar34;
      } while (uVar34 != 0);
    }
    if ((pgVar27[uVar20].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)((string_view *)
                 &(ppVar21->second).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                  .arrays.groups_size_mask)->_M_len;
    pbVar29 = &ppVar18->first;
    ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)((long)&(ppVar18->first)._M_len + 1);
    uVar20 = (long)&pbVar29->_M_len + uVar20 + 1 & (ulong)ppVar36;
  } while (ppVar18 <= ppVar36);
  ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
LAB_001db202:
  if (ppVar36 ==
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
       *)0x0) {
    if ((ppVar21->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.size <
        (ppVar21->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)puVar1,(arrays_type *)puVar1,uVar31,uVar17,&local_211,&local_1f8);
      psVar12 = &(ppVar21->second).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                 .size_ctrl.size;
      *psVar12 = *psVar12 + 1;
      ppVar36 = local_200;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)puVar1,uVar17,&local_211,&local_1f8);
      ppVar36 = local_200;
    }
  }
  *(Kind *)&(ppVar36->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_size_index = LintOn;
  ptVar13 = &(ppVar36->second).table_;
  (ptVar13->
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  ).arrays.groups_size_mask = 0;
  (ptVar13->
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  ).arrays.groups_ = (group_type_pointer)0x0;
  local_1d0._M_len = 5;
  local_1d0._M_str = "slang";
  uVar17 = detail::hashing::hash("slang",5);
  uVar31 = uVar17 >> ((byte)local_1b0[0] & 0x3f);
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar17 & 0xff];
  local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)local_1b0._8_8_;
  pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  uVar20 = uVar31;
  do {
    pbVar23 = (basic_string_view<char,_std::char_traits<char>_> *)(local_1b0._16_8_ + uVar20 * 0x10)
    ;
    uVar39 = (uchar)uVar4;
    auVar55[0] = -(((slot_type *)&pbVar23->_M_len)->n == uVar39);
    uVar44 = (uchar)((uint)uVar4 >> 8);
    auVar55[1] = -(((slot_type *)&pbVar23->_M_len)[1].n == uVar44);
    uVar46 = (uchar)((uint)uVar4 >> 0x10);
    auVar55[2] = -(((slot_type *)&pbVar23->_M_len)[2].n == uVar46);
    uVar48 = (uchar)((uint)uVar4 >> 0x18);
    auVar55[3] = -(((slot_type *)&pbVar23->_M_len)[3].n == uVar48);
    auVar55[4] = -(((slot_type *)&pbVar23->_M_len)[4].n == uVar39);
    auVar55[5] = -(((slot_type *)&pbVar23->_M_len)[5].n == uVar44);
    auVar55[6] = -(((slot_type *)&pbVar23->_M_len)[6].n == uVar46);
    auVar55[7] = -(((slot_type *)&pbVar23->_M_len)[7].n == uVar48);
    auVar55[8] = -(*(uchar *)&pbVar23->_M_str == uVar39);
    auVar55[9] = -(((slot_type *)((long)&pbVar23->_M_str + 1))->n == uVar44);
    auVar55[10] = -(((slot_type *)((long)&pbVar23->_M_str + 2))->n == uVar46);
    auVar55[0xb] = -(((slot_type *)((long)&pbVar23->_M_str + 3))->n == uVar48);
    auVar55[0xc] = -(((slot_type *)((long)&pbVar23->_M_str + 4))->n == uVar39);
    auVar55[0xd] = -(((slot_type *)((long)&pbVar23->_M_str + 5))->n == uVar44);
    auVar55[0xe] = -(((slot_type *)((long)&pbVar23->_M_str + 6))->n == uVar46);
    auVar55[0xf] = -(((slot_type *)((long)&pbVar23->_M_str + 7))->n == uVar48);
    for (uVar34 = (uint)(ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe); uVar34 != 0;
        uVar34 = uVar34 - 1 & uVar34) {
      iVar15 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
        }
      }
      ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)((long)&ppStack_198[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar15 << 6));
      if (*(long *)((long)&ppStack_198[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar15 << 6)) == 5
         ) {
        piVar5 = (int *)(ppVar21->first)._M_str;
        bVar37 = (char)piVar5[1] == 'g' && *piVar5 == 0x6e616c73;
      }
      else {
        bVar37 = false;
      }
      if (bVar37) goto LAB_001db37e;
    }
    if ((((slot_type *)
         ((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                 (local_1b0._16_8_ + uVar20 * 0x10))->_M_str + 7))->n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    psVar12 = &pbVar29->_M_len;
    pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&pbVar29->_M_len + 1);
    uVar20 = (ulong)((long)psVar12 + uVar20 + 1) & local_1b0._8_8_;
  } while (pbVar29 <= (ulong)local_1b0._8_8_);
  ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
LAB_001db37e:
  if (ppVar21 ==
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
       *)0x0) {
    if (local_188 < local_190) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,(arrays_type *)local_1b0,uVar31,uVar17,
                 (try_emplace_args_t *)&local_1f8,&local_1d0);
      local_188 = local_188 + 1;
      ppVar21 = local_200;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,uVar17,(try_emplace_args_t *)&local_1f8,&local_1d0);
      ppVar21 = local_200;
    }
  }
  puVar1 = &ppVar21->second;
  local_1f8._M_len = 9;
  local_1f8._M_str = "lint_save";
  uVar17 = detail::hashing::hash("lint_save",9);
  uVar31 = uVar17 >> ((char)*(Kind *)&(ppVar21->second).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                      .arrays.groups_size_index & 0x3f);
  pgVar27 = (ppVar21->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar17 & 0xff];
  uVar35 = 0;
  uVar20 = uVar31;
  do {
    pgVar28 = pgVar27 + uVar20;
    uVar39 = (uchar)uVar4;
    auVar56[0] = -(pgVar28->m[0].n == uVar39);
    uVar44 = (uchar)((uint)uVar4 >> 8);
    auVar56[1] = -(pgVar28->m[1].n == uVar44);
    uVar46 = (uchar)((uint)uVar4 >> 0x10);
    auVar56[2] = -(pgVar28->m[2].n == uVar46);
    uVar48 = (uchar)((uint)uVar4 >> 0x18);
    auVar56[3] = -(pgVar28->m[3].n == uVar48);
    auVar56[4] = -(pgVar28->m[4].n == uVar39);
    auVar56[5] = -(pgVar28->m[5].n == uVar44);
    auVar56[6] = -(pgVar28->m[6].n == uVar46);
    auVar56[7] = -(pgVar28->m[7].n == uVar48);
    auVar56[8] = -(pgVar28->m[8].n == uVar39);
    auVar56[9] = -(pgVar28->m[9].n == uVar44);
    auVar56[10] = -(pgVar28->m[10].n == uVar46);
    auVar56[0xb] = -(pgVar28->m[0xb].n == uVar48);
    auVar56[0xc] = -(pgVar28->m[0xc].n == uVar39);
    auVar56[0xd] = -(pgVar28->m[0xd].n == uVar44);
    auVar56[0xe] = -(pgVar28->m[0xe].n == uVar46);
    auVar56[0xf] = -(pgVar28->m[0xf].n == uVar48);
    uVar34 = (uint)(ushort)((ushort)(SUB161(auVar56 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe);
    if (uVar34 != 0) {
      do {
        uVar19 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)((ppVar21->second).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                      .arrays.elements_ + uVar20 * 0xf + (ulong)uVar19);
        if ((ppVar18->first)._M_len == 9) {
          plVar7 = (long *)(ppVar18->first)._M_str;
          bVar37 = (char)plVar7[1] == 'e' && *plVar7 == 0x7661735f746e696c;
        }
        else {
          bVar37 = false;
        }
        local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)puVar1;
        if (bVar37) goto LAB_001db4f2;
        uVar34 = uVar34 - 1 & uVar34;
      } while (uVar34 != 0);
    }
    if ((pgVar27[uVar20].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    uVar6 = ((string_view *)
            &(ppVar21->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_size_mask)->_M_len;
    lVar33 = uVar20 + uVar35;
    uVar35 = uVar35 + 1;
    uVar20 = lVar33 + 1U & uVar6;
  } while (uVar35 <= uVar6);
  ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
LAB_001db4f2:
  if (ppVar18 ==
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
       *)0x0) {
    if ((ppVar21->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.size <
        (ppVar21->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)puVar1,(arrays_type *)puVar1,uVar31,uVar17,&local_211,&local_1f8);
      psVar12 = &(ppVar21->second).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                 .size_ctrl.size;
      *psVar12 = *psVar12 + 1;
      ppVar18 = local_200;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)puVar1,uVar17,&local_211,&local_1f8);
      ppVar18 = local_200;
    }
  }
  *(Kind *)&(ppVar18->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_size_index = LintSave;
  ptVar13 = &(ppVar18->second).table_;
  (ptVar13->
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  ).arrays.groups_size_mask = 0;
  (ptVar13->
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  ).arrays.groups_ = (group_type_pointer)0x0;
  local_1d0._M_len = 5;
  local_1d0._M_str = "slang";
  uVar17 = detail::hashing::hash("slang",5);
  uVar31 = uVar17 >> ((byte)local_1b0[0] & 0x3f);
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar17 & 0xff];
  local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)local_1b0._8_8_;
  pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  uVar20 = uVar31;
  do {
    pbVar23 = (basic_string_view<char,_std::char_traits<char>_> *)(local_1b0._16_8_ + uVar20 * 0x10)
    ;
    uVar39 = (uchar)uVar4;
    auVar57[0] = -(((slot_type *)&pbVar23->_M_len)->n == uVar39);
    uVar44 = (uchar)((uint)uVar4 >> 8);
    auVar57[1] = -(((slot_type *)&pbVar23->_M_len)[1].n == uVar44);
    uVar46 = (uchar)((uint)uVar4 >> 0x10);
    auVar57[2] = -(((slot_type *)&pbVar23->_M_len)[2].n == uVar46);
    uVar48 = (uchar)((uint)uVar4 >> 0x18);
    auVar57[3] = -(((slot_type *)&pbVar23->_M_len)[3].n == uVar48);
    auVar57[4] = -(((slot_type *)&pbVar23->_M_len)[4].n == uVar39);
    auVar57[5] = -(((slot_type *)&pbVar23->_M_len)[5].n == uVar44);
    auVar57[6] = -(((slot_type *)&pbVar23->_M_len)[6].n == uVar46);
    auVar57[7] = -(((slot_type *)&pbVar23->_M_len)[7].n == uVar48);
    auVar57[8] = -(*(uchar *)&pbVar23->_M_str == uVar39);
    auVar57[9] = -(((slot_type *)((long)&pbVar23->_M_str + 1))->n == uVar44);
    auVar57[10] = -(((slot_type *)((long)&pbVar23->_M_str + 2))->n == uVar46);
    auVar57[0xb] = -(((slot_type *)((long)&pbVar23->_M_str + 3))->n == uVar48);
    auVar57[0xc] = -(((slot_type *)((long)&pbVar23->_M_str + 4))->n == uVar39);
    auVar57[0xd] = -(((slot_type *)((long)&pbVar23->_M_str + 5))->n == uVar44);
    auVar57[0xe] = -(((slot_type *)((long)&pbVar23->_M_str + 6))->n == uVar46);
    auVar57[0xf] = -(((slot_type *)((long)&pbVar23->_M_str + 7))->n == uVar48);
    for (uVar34 = (uint)(ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe); uVar34 != 0;
        uVar34 = uVar34 - 1 & uVar34) {
      iVar15 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
        }
      }
      ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)((long)&ppStack_198[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar15 << 6));
      if (*(long *)((long)&ppStack_198[uVar20 * 0xf].first._M_len + (ulong)(uint)(iVar15 << 6)) == 5
         ) {
        piVar5 = (int *)(ppVar21->first)._M_str;
        bVar37 = (char)piVar5[1] == 'g' && *piVar5 == 0x6e616c73;
      }
      else {
        bVar37 = false;
      }
      if (bVar37) goto LAB_001db665;
    }
    if ((((slot_type *)
         ((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                 (local_1b0._16_8_ + uVar20 * 0x10))->_M_str + 7))->n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    psVar12 = &pbVar29->_M_len;
    pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&pbVar29->_M_len + 1);
    uVar20 = (ulong)((long)psVar12 + uVar20 + 1) & local_1b0._8_8_;
  } while (pbVar29 <= (ulong)local_1b0._8_8_);
  ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
LAB_001db665:
  if (ppVar21 ==
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
       *)0x0) {
    if (local_188 < local_190) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,(arrays_type *)local_1b0,uVar31,uVar17,
                 (try_emplace_args_t *)&local_1f8,&local_1d0);
      local_188 = local_188 + 1;
      ppVar21 = local_200;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_210,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                  *)local_1b0,uVar17,(try_emplace_args_t *)&local_1f8,&local_1d0);
      ppVar21 = local_200;
    }
  }
  local_1e8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
               *)&ppVar21->second;
  local_1f8._M_len = 0xc;
  local_1f8._M_str = "lint_restore";
  uVar17 = detail::hashing::hash("lint_restore",0xc);
  pDVar14 = local_1c0;
  uVar31 = uVar17 >> ((char)*(Kind *)&(ppVar21->second).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                      .arrays.groups_size_index & 0x3f);
  pgVar27 = (ppVar21->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar17 & 0xff];
  uVar35 = 0;
  uVar20 = uVar31;
  while( true ) {
    pgVar28 = pgVar27 + uVar20;
    uVar39 = (uchar)uVar4;
    auVar58[0] = -(pgVar28->m[0].n == uVar39);
    uVar44 = (uchar)((uint)uVar4 >> 8);
    auVar58[1] = -(pgVar28->m[1].n == uVar44);
    uVar46 = (uchar)((uint)uVar4 >> 0x10);
    auVar58[2] = -(pgVar28->m[2].n == uVar46);
    uVar48 = (uchar)((uint)uVar4 >> 0x18);
    auVar58[3] = -(pgVar28->m[3].n == uVar48);
    auVar58[4] = -(pgVar28->m[4].n == uVar39);
    auVar58[5] = -(pgVar28->m[5].n == uVar44);
    auVar58[6] = -(pgVar28->m[6].n == uVar46);
    auVar58[7] = -(pgVar28->m[7].n == uVar48);
    auVar58[8] = -(pgVar28->m[8].n == uVar39);
    auVar58[9] = -(pgVar28->m[9].n == uVar44);
    auVar58[10] = -(pgVar28->m[10].n == uVar46);
    auVar58[0xb] = -(pgVar28->m[0xb].n == uVar48);
    auVar58[0xc] = -(pgVar28->m[0xc].n == uVar39);
    auVar58[0xd] = -(pgVar28->m[0xd].n == uVar44);
    auVar58[0xe] = -(pgVar28->m[0xe].n == uVar46);
    auVar58[0xf] = -(pgVar28->m[0xf].n == uVar48);
    uVar34 = (uint)(ushort)((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe);
    if (uVar34 != 0) {
      do {
        uVar19 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                   *)((ppVar21->second).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                      .arrays.elements_ + uVar20 * 0xf + (ulong)uVar19);
        if ((ppVar18->first)._M_len == 0xc) {
          plVar7 = (long *)(ppVar18->first)._M_str;
          bVar37 = (int)plVar7[1] == 0x65726f74 && *plVar7 == 0x7365725f746e696c;
        }
        else {
          bVar37 = false;
        }
        if (bVar37) goto LAB_001db7e7;
        uVar34 = uVar34 - 1 & uVar34;
      } while (uVar34 != 0);
    }
    if ((pgVar27[uVar20].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
    uVar6 = ((string_view *)
            &(ppVar21->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .arrays.groups_size_mask)->_M_len;
    lVar33 = uVar20 + uVar35;
    uVar35 = uVar35 + 1;
    uVar20 = lVar33 + 1U & uVar6;
    if (uVar6 < uVar35) {
      ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                 *)0x0;
LAB_001db7e7:
      if (ppVar18 ==
          (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
           *)0x0) {
        if ((ppVar21->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .size_ctrl.size <
            (ppVar21->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)local_210,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                      *)local_1e8,(arrays_type *)local_1e8,uVar31,uVar17,&local_211,&local_1f8);
          psVar12 = &(ppVar21->second).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                     .size_ctrl.size;
          *psVar12 = *psVar12 + 1;
          ppVar18 = local_200;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)local_210,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                      *)local_1e8,uVar17,&local_211,&local_1f8);
          ppVar18 = local_200;
        }
      }
      this_00 = local_e8;
      *(Kind *)&(ppVar18->second).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                .arrays.groups_size_index = LintRestore;
      ptVar13 = &(ppVar18->second).table_;
      (ptVar13->
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      ).arrays.groups_size_mask = 0;
      (ptVar13->
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      ).arrays.groups_ = (group_type_pointer)0x0;
      local_210._0_4_ = 0x400;
      if ((pDVar14->options).maxParseDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload
          .super__Optional_payload_base<unsigned_int>._M_engaged == true) {
        local_210._0_4_ =
             (pDVar14->options).maxParseDepth.super__Optional_base<unsigned_int,_true,_true>.
             _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value;
      }
      local_210._4_4_ = pDVar14->languageVersion;
      Bag::set<slang::driver::SourceOptions&>(local_e8,&local_118);
      Bag::set<slang::parsing::PreprocessorOptions&>(this_00,(PreprocessorOptions *)local_d0);
      Bag::set<slang::parsing::LexerOptions&>(this_00,(LexerOptions *)local_1b0);
      Bag::set<slang::parsing::ParserOptions&>(this_00,(ParserOptions *)local_210);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                     *)local_1b0);
      if ((value_type_pointer)local_50._8_8_ != (value_type_pointer)0x0) {
        operator_delete((void *)local_50._8_8_,(long)local_58 * 0x100 + 0x100);
      }
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      if ((undefined1 *)local_d0._8_8_ != local_d0 + 0x18) {
        operator_delete((void *)local_d0._8_8_,
                        CONCAT26(local_d0._30_2_,CONCAT24(local_d0._28_2_,local_d0._24_4_)) + 1);
      }
      return;
    }
  }
  ppVar18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
             *)0x0;
  goto LAB_001db7e7;
}

Assistant:

void Driver::addParseOptions(Bag& bag) const {
    SourceOptions soptions;
    soptions.numThreads = options.numThreads;
    soptions.singleUnit = options.singleUnit == true;
    soptions.onlyLint = options.lintMode();
    soptions.librariesInheritMacros = options.librariesInheritMacros == true;

    PreprocessorOptions ppoptions;
    ppoptions.predefines = options.defines;
    ppoptions.undefines = options.undefines;
    ppoptions.predefineSource = "<command-line>";
    ppoptions.languageVersion = languageVersion;
    if (options.maxIncludeDepth.has_value())
        ppoptions.maxIncludeDepth = *options.maxIncludeDepth;
    for (const auto& d : options.ignoreDirectives)
        ppoptions.ignoreDirectives.emplace(d);

    LexerOptions loptions;
    loptions.languageVersion = languageVersion;
    loptions.enableLegacyProtect = options.enableLegacyProtect == true;
    if (options.maxLexerErrors.has_value())
        loptions.maxErrors = *options.maxLexerErrors;

    if (loptions.enableLegacyProtect)
        loptions.commentHandlers["pragma"]["protect"] = {CommentHandler::Protect};

    for (auto& [common, start, end] : translateOffFormats)
        loptions.commentHandlers[common][start] = {CommentHandler::TranslateOff, end};

    loptions.commentHandlers["slang"]["lint_off"] = {CommentHandler::LintOff};
    loptions.commentHandlers["slang"]["lint_on"] = {CommentHandler::LintOn};
    loptions.commentHandlers["slang"]["lint_save"] = {CommentHandler::LintSave};
    loptions.commentHandlers["slang"]["lint_restore"] = {CommentHandler::LintRestore};

    ParserOptions poptions;
    poptions.languageVersion = languageVersion;
    if (options.maxParseDepth.has_value())
        poptions.maxRecursionDepth = *options.maxParseDepth;

    bag.set(soptions);
    bag.set(ppoptions);
    bag.set(loptions);
    bag.set(poptions);
}